

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O0

void basic_datatype_test_integral<short,true>(string *name)

{
  string local_60;
  value_type_conflict5 local_2e;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  vector<short,_std::allocator<short>_> v;
  string *name_local;
  
  v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)name;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)local_28);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    local_2e = (value_type_conflict5)local_2c;
    std::vector<short,_std::allocator<short>_>::push_back
              ((vector<short,_std::allocator<short>_> *)local_28,&local_2e);
  }
  std::__cxx11::string::string((string *)&local_60,(string *)name);
  runtest_maybe_dobin<std::vector<short,std::allocator<short>>,true>
            (&local_60,(vector<short,_std::allocator<short>_> *)local_28);
  std::__cxx11::string::~string((string *)&local_60);
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)local_28);
  return;
}

Assistant:

void basic_datatype_test_integral(std::string name) {
    std::vector<T> v;
    for(int i=0; i<4; i++) {
        v.push_back(i);
    }
    runtest_maybe_dobin<std::vector<T>, DoBinary>(name, v);
}